

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O1

CAmount __thiscall wallet::SelectionResult::GetSelectedValue(SelectionResult *this)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  for (p_Var2 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    lVar3 = lVar3 + *(long *)(*(long *)(p_Var2 + 1) + 0x48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar3;
  }
  __stack_chk_fail();
}

Assistant:

CAmount SelectionResult::GetSelectedValue() const
{
    return std::accumulate(m_selected_inputs.cbegin(), m_selected_inputs.cend(), CAmount{0}, [](CAmount sum, const auto& coin) { return sum + coin->txout.nValue; });
}